

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O2

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  uint _h;
  size_t _elemsize;
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  pointer piVar4;
  long lVar5;
  int k;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int i_2;
  int iVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  int i_1;
  ulong uVar17;
  int i;
  ulong uVar18;
  uint uVar19;
  int j;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  allocator_type local_179;
  Mat *local_178;
  LRN *local_170;
  Mat local_168;
  ulong local_118;
  long local_110;
  void *local_108;
  ulong local_100;
  Mat local_f8;
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar6 = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  uVar11 = (ulong)_h;
  uVar19 = bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,uVar6,_h,uVar19,_elemsize,opt->workspace_allocator);
  iVar10 = -100;
  iVar7 = iVar10;
  if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) goto LAB_002d6e4b;
  local_110 = (long)(int)uVar6;
  pvVar14 = bottom_top_blob->data;
  sVar1 = bottom_top_blob->cstep;
  uVar17 = 0;
  uVar21 = (ulong)(_h * uVar6);
  if ((int)(_h * uVar6) < 1) {
    uVar21 = uVar17;
  }
  uVar20 = 0;
  if (0 < (int)uVar19) {
    uVar20 = (ulong)uVar19;
  }
  sVar2 = bottom_top_blob->elemsize;
  pvVar8 = local_f8.data;
  for (; uVar17 != uVar20; uVar17 = uVar17 + 1) {
    for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
      fVar23 = *(float *)((long)pvVar14 + uVar18 * 4);
      *(float *)((long)pvVar8 + uVar18 * 4) = fVar23 * fVar23;
    }
    pvVar8 = (void *)((long)pvVar8 +
                     local_f8.cstep *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    pvVar14 = (void *)((long)pvVar14 + sVar1 * sVar2);
  }
  local_170 = (LRN *)opt;
  if (this->region_type == 0) {
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar6,_h,uVar19,_elemsize,opt->workspace_allocator);
    if ((local_168.data == (void *)0x0) || (local_168.cstep * (long)local_168.c == 0)) {
      piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar7 = -100;
      goto LAB_002d6e4b;
    }
    uVar6 = (int)local_168.cstep * local_168.c;
    uVar17 = 0;
    uVar11 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar11 = uVar17;
    }
    for (; (int)uVar11 != (int)uVar17; uVar17 = uVar17 + 1) {
      *(undefined4 *)((long)local_168.data + uVar17 * 4) = 0;
    }
    iVar7 = this->local_size;
    local_170 = (LRN *)CONCAT44(local_170._4_4_,this->alpha);
    pvVar14 = bottom_top_blob->data;
    local_110 = (long)(iVar7 / 2);
    local_100 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
    local_108 = (void *)(bottom_top_blob->cstep * bottom_top_blob->elemsize);
    uVar11 = 0;
    pvVar8 = local_168.data;
    local_118 = uVar20;
    while (uVar11 != local_118) {
      for (uVar6 = iVar7 / -2 + (int)uVar11; (long)(int)uVar6 <= (long)(local_110 + uVar11);
          uVar6 = uVar6 + 1) {
        if ((int)uVar6 < (int)uVar19 && -1 < (int)uVar6) {
          for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
            *(float *)((long)pvVar8 + uVar17 * 4) =
                 *(float *)((long)pvVar8 + uVar17 * 4) +
                 *(float *)((long)local_f8.data +
                           uVar17 * 4 +
                           (ulong)uVar6 *
                           local_f8.cstep *
                           CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
          }
        }
      }
      local_178 = (Mat *)uVar11;
      for (uVar17 = 0; uVar21 != uVar17; uVar17 = uVar17 + 1) {
        fVar23 = powf(*(float *)((long)pvVar8 + uVar17 * 4) * local_170._0_4_ * (1.0 / (float)iVar7)
                      + this->bias,-this->beta);
        *(float *)((long)pvVar14 + uVar17 * 4) = fVar23 * *(float *)((long)pvVar14 + uVar17 * 4);
      }
      pvVar8 = (void *)((long)pvVar8 + local_100);
      pvVar14 = (void *)((long)pvVar14 + (long)local_108);
      uVar11 = (long)local_178 + 1;
    }
    piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_168.allocator == (Allocator *)0x0) goto LAB_002d7487;
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar7 = 0;
    if (this->region_type != 1) goto LAB_002d6e4b;
    piVar3 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    local_168.data = local_f8.data;
    local_168.refcount._0_4_ = local_f8.refcount._0_4_;
    local_168.refcount._4_4_ = local_f8.refcount._4_4_;
    local_168.elemsize._0_4_ = (undefined4)local_f8.elemsize;
    local_168.elemsize._4_4_ = local_f8.elemsize._4_4_;
    local_168.elempack = local_f8.elempack;
    local_168.allocator = local_f8.allocator;
    local_168.dims = local_f8.dims;
    local_168.w = local_f8.w;
    local_168.h = local_f8.h;
    local_168.d = local_f8.d;
    local_168.c = local_f8.c;
    local_168.cstep = local_f8.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    uVar19 = this->local_size;
    uVar9 = uVar6;
    if (1 < (int)uVar19) {
      uVar9 = uVar19 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_f8,&local_168,uVar9,~uVar9 + uVar19,uVar9,~uVar9 + uVar19,0,0.0,
                       (Option *)&_space_ofs);
      if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0)) {
        piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        iVar7 = iVar10;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_002d6e4b;
      }
      uVar19 = this->local_size;
      uVar9 = local_168.w;
    }
    uVar19 = uVar19 * uVar19;
    fVar23 = this->alpha;
    local_178 = bottom_top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar19,&local_179);
    piVar4 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = this->local_size;
    iVar12 = uVar9 - iVar7;
    lVar5 = 0;
    iVar10 = 0;
    for (iVar13 = 0; iVar13 < iVar7; iVar13 = iVar13 + 1) {
      for (lVar16 = 0; iVar15 = (int)lVar16, iVar15 < iVar7; lVar16 = lVar16 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar5 + lVar16] = iVar10 + iVar15;
        iVar7 = this->local_size;
      }
      iVar10 = iVar10 + iVar12 + iVar15;
      lVar5 = (int)lVar5 + lVar16;
    }
    local_90 = local_178->cstep * local_178->elemsize;
    local_98 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
    local_80 = (long)local_168.w * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
    ;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    local_a0 = local_178->data;
    if ((int)_h < 1) {
      uVar11 = 0;
    }
    local_a8 = local_168.data;
    local_178 = (Mat *)CONCAT44(local_178._4_4_,1.0 / (float)(int)uVar19);
    uVar21 = 0;
    local_170 = this;
    local_118 = uVar20;
    while (uVar21 != local_118) {
      pvVar14 = (void *)(local_90 * uVar21 + (long)local_a0);
      local_108 = (void *)(local_98 * uVar21 + (long)local_a8);
      uVar17 = 0;
      local_88 = uVar21;
      while (pvVar8 = local_108, uVar17 != uVar11) {
        lVar5 = local_80 * uVar17;
        local_100 = uVar17;
        for (uVar21 = 0; uVar21 != uVar6; uVar21 = uVar21 + 1) {
          fVar22 = 0.0;
          for (uVar17 = 0; uVar19 != uVar17; uVar17 = uVar17 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar8 +
                                        (long)piVar4[uVar17] * 4 + uVar21 * 4 + lVar5);
          }
          fVar22 = powf(fVar22 * fVar23 * local_178._0_4_ + local_170->bias,-local_170->beta);
          *(float *)((long)pvVar14 + uVar21 * 4) = fVar22 * *(float *)((long)pvVar14 + uVar21 * 4);
        }
        pvVar14 = (void *)((long)pvVar14 + local_110 * 4);
        uVar17 = local_100 + 1;
      }
      uVar21 = local_88 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar3 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
LAB_002d7487:
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar7 = 0;
LAB_002d6e4b:
  piVar3 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        free(local_f8.data);
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * powf(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}